

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testObserveDoubleNoTags_Test::~Engine_testObserveDoubleNoTags_Test
          (Engine_testObserveDoubleNoTags_Test *this)

{
  void *in_RDI;
  
  ~Engine_testObserveDoubleNoTags_Test((Engine_testObserveDoubleNoTags_Test *)0x1305a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testObserveDoubleNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Observe("histo.value", 100.0005);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.histo.value", im.name);
    ASSERT_EQ(MetricType::Histogram, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(0, im.tags.size());
}